

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.hpp
# Opt level: O2

void __thiscall Sinclair::ZXSpectrum::Video::State::State(State *this)

{
  allocator<char> local_29;
  string local_28;
  
  (this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__0058f200;
  this->border_colour = '\0';
  this->half_cycles_since_interrupt = 0;
  this->flash = false;
  this->flash_counter = 0;
  this->is_alternate_line = false;
  if (Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::contents__abi_cxx11_._M_h.
      _M_element_count == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"border_colour",&local_29);
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare<unsigned_char>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,&this->border_colour,
               &local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"half_cycles_since_interrupt",&local_29);
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare<int>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,
               &this->half_cycles_since_interrupt,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"flash",&local_29);
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare<bool>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,&this->flash,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"flash_counter",&local_29);
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare<int>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,&this->flash_counter,
               &local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"is_alternate_line",&local_29);
    Reflection::StructImpl<Sinclair::ZXSpectrum::Video::State>::declare<bool>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::Video::State>,&this->is_alternate_line,
               &local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

State() {
		if(needs_declare()) {
			DeclareField(border_colour);
			DeclareField(half_cycles_since_interrupt);
			DeclareField(flash);
			DeclareField(flash_counter);
			DeclareField(is_alternate_line);
		}
	}